

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

int soplex::
    SPxQuicksortPart<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
              (IdxElement *keys,IdxCompare *compare,int start,int end,int size,int start2,int end2,
              bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  IdxElement *pIVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  double *pdVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  IdxElement tmp;
  
  if (end <= start) {
    return 0;
  }
  if (start + 1 == end) {
    return 1;
  }
  if (start2 <= start) {
    start2 = start;
  }
  uVar4 = end - 1;
  if ((int)uVar4 <= start2 + size) {
    SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
              (keys,end,compare,start2,type);
    return uVar4;
  }
  iVar12 = (int)(start2 + uVar4) / 2;
  pIVar1 = keys + iVar12;
  dVar5 = keys[iVar12].val;
  lVar17 = (long)(int)uVar4;
  lVar16 = (long)start2;
  uVar10 = uVar4;
  uVar14 = start2;
  do {
    uVar11 = (ulong)uVar10;
    uVar15 = uVar14;
    if (type) {
      if ((int)uVar14 < (int)uVar4) {
        pdVar13 = &keys[(int)uVar14].val;
        lVar18 = 0;
        do {
          if (*pdVar13 <= dVar5) {
            uVar15 = uVar14 - (int)lVar18;
            break;
          }
          lVar18 = lVar18 + -1;
          pdVar13 = pdVar13 + 2;
          uVar15 = uVar4;
        } while (-lVar17 + (long)(int)uVar14 != lVar18);
      }
      if (start2 < (int)uVar10) {
        uVar11 = (ulong)(int)uVar10;
        pdVar13 = &keys[uVar11].val;
        do {
          dVar6 = *pdVar13;
          if (((dVar6 != dVar5) || (NAN(dVar6) || NAN(dVar5))) && (dVar5 - dVar6 < 0.0))
          goto LAB_00230297;
          uVar11 = uVar11 - 1;
          pdVar13 = pdVar13 + -2;
        } while (lVar16 < (long)uVar11);
LAB_00230294:
        uVar11 = (ulong)(uint)start2;
      }
    }
    else {
      if ((int)uVar14 < (int)uVar4) {
        pdVar13 = &keys[(int)uVar14].val;
        lVar18 = 0;
        do {
          dVar6 = *pdVar13;
          if (((dVar6 != dVar5) || (NAN(dVar6) || NAN(dVar5))) && (0.0 < dVar5 - dVar6)) {
            uVar15 = uVar14 - (int)lVar18;
            break;
          }
          lVar18 = lVar18 + -1;
          pdVar13 = pdVar13 + 2;
          uVar15 = uVar4;
        } while (-lVar17 + (long)(int)uVar14 != lVar18);
      }
      if (start2 < (int)uVar10) {
        uVar11 = (ulong)(int)uVar10;
        pdVar13 = &keys[uVar11].val;
        do {
          if (dVar5 < *pdVar13 || dVar5 == *pdVar13) goto LAB_00230297;
          uVar11 = uVar11 - 1;
          pdVar13 = pdVar13 + -2;
        } while (lVar16 < (long)uVar11);
        goto LAB_00230294;
      }
    }
LAB_00230297:
    uVar10 = (uint)uVar11;
    if ((int)uVar10 <= (int)uVar15) break;
    pIVar2 = keys + (int)uVar15;
    iVar12 = pIVar2->idx;
    uVar9 = *(undefined4 *)&pIVar2->field_0x4;
    dVar6 = pIVar2->val;
    pIVar2 = keys + (int)uVar10;
    uVar8 = *(undefined4 *)&pIVar2->field_0x4;
    dVar7 = pIVar2->val;
    pIVar3 = keys + (int)uVar15;
    pIVar3->idx = pIVar2->idx;
    *(undefined4 *)&pIVar3->field_0x4 = uVar8;
    pIVar3->val = dVar7;
    pIVar2 = keys + (int)uVar10;
    pIVar2->idx = iVar12;
    *(undefined4 *)&pIVar2->field_0x4 = uVar9;
    pIVar2->val = dVar6;
    uVar14 = uVar15 + 1;
    uVar10 = uVar10 - 1;
  } while( true );
  if (type) {
    if ((int)uVar15 < (int)uVar4) {
      pdVar13 = &keys[(int)uVar15].val;
      uVar14 = uVar15;
      do {
        dVar6 = *pdVar13;
        if (((dVar5 != dVar6) || (NAN(dVar5) || NAN(dVar6))) &&
           (uVar15 = uVar14, dVar6 - dVar5 < 0.0)) break;
        uVar14 = uVar14 + 1;
        pdVar13 = pdVar13 + 2;
        uVar15 = uVar4;
      } while (uVar4 != uVar14);
    }
    if (uVar15 == start2) {
      pIVar2 = keys + lVar16;
      iVar12 = pIVar2->idx;
      uVar9 = *(undefined4 *)&pIVar2->field_0x4;
      dVar5 = pIVar2->val;
      uVar8 = *(undefined4 *)&pIVar1->field_0x4;
      dVar6 = pIVar1->val;
      pIVar2 = keys + lVar16;
      pIVar2->idx = pIVar1->idx;
      *(undefined4 *)&pIVar2->field_0x4 = uVar8;
      pIVar2->val = dVar6;
      pIVar1->idx = iVar12;
      *(undefined4 *)&pIVar1->field_0x4 = uVar9;
      pIVar1->val = dVar5;
      uVar15 = start2 + 1;
    }
  }
  else {
    if (start2 < (int)uVar10) {
      uVar11 = (ulong)(int)uVar10;
      pdVar13 = &keys[uVar11].val;
      do {
        dVar6 = *pdVar13;
        if (((dVar5 != dVar6) || (NAN(dVar5) || NAN(dVar6))) && (0.0 < dVar6 - dVar5))
        goto LAB_002303a5;
        uVar11 = uVar11 - 1;
        pdVar13 = pdVar13 + -2;
      } while (lVar16 < (long)uVar11);
      uVar11 = (ulong)(uint)start2;
    }
LAB_002303a5:
    uVar10 = (uint)uVar11;
    if (uVar10 == uVar4) {
      pIVar2 = keys + lVar17;
      iVar12 = pIVar2->idx;
      uVar9 = *(undefined4 *)&pIVar2->field_0x4;
      dVar5 = pIVar2->val;
      uVar8 = *(undefined4 *)&pIVar1->field_0x4;
      dVar6 = pIVar1->val;
      pIVar2 = keys + lVar17;
      pIVar2->idx = pIVar1->idx;
      *(undefined4 *)&pIVar2->field_0x4 = uVar8;
      pIVar2->val = dVar6;
      pIVar1->idx = iVar12;
      *(undefined4 *)&pIVar1->field_0x4 = uVar9;
      pIVar1->val = dVar5;
      uVar10 = end - 2;
    }
  }
  if ((int)(uVar10 - start2) < size * 2) {
    SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
              (keys,uVar10 + 1,compare,start2,!type);
    if (size <= (int)(uVar15 - start2)) {
      return uVar15 - 1;
    }
    size = (start2 + size) - uVar15;
    start2 = uVar15;
  }
  else {
    end = uVar10 + 1;
  }
  iVar12 = SPxQuicksortPart<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                     (keys,compare,start,end,size,start2,end2,!type);
  return iVar12;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}